

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pinger.c
# Opt level: O0

void pinger_timer(void *ctx,unsigned_long now)

{
  Pinger *pinger;
  unsigned_long now_local;
  void *ctx_local;
  
  if (((*(byte *)((long)ctx + 4) & 1) != 0) && (now == *(unsigned_long *)((long)ctx + 0x10))) {
    backend_special(*(Backend **)((long)ctx + 0x18),SS_PING,0);
    *(undefined1 *)((long)ctx + 4) = 0;
    pinger_schedule((Pinger *)ctx);
  }
  return;
}

Assistant:

static void pinger_timer(void *ctx, unsigned long now)
{
    Pinger *pinger = (Pinger *)ctx;

    if (pinger->pending && now == pinger->next) {
        backend_special(pinger->backend, SS_PING, 0);
        pinger->pending = false;
        pinger_schedule(pinger);
    }
}